

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O1

void __thiscall
Catch::CumulativeReporterBase::testCaseEnded
          (CumulativeReporterBase *this,TestCaseStats *testCaseStats)

{
  Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *in_RAX;
  unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  node;
  unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  local_18;
  
  local_18.m_ptr = in_RAX;
  Detail::
  make_unique<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,Catch::CumulativeReporterBase::SectionNode>,Catch::TestCaseStats_const&>
            ((Detail *)&local_18,testCaseStats);
  if ((this->m_sectionStack).
      super__Vector_base<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_sectionStack).
      super__Vector_base<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("m_sectionStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.cpp"
                  ,0x2341,
                  "virtual void Catch::CumulativeReporterBase::testCaseEnded(const TestCaseStats &)"
                 );
  }
  if (local_18.m_ptr !=
      (Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *)0x0) {
    std::
    vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>>>
    ::emplace_back<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>>
              ((vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>>>
                *)&(local_18.m_ptr)->children,&this->m_rootSection);
    std::
    vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,Catch::CumulativeReporterBase::SectionNode>>,std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,Catch::CumulativeReporterBase::SectionNode>>>>
    ::
    emplace_back<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,Catch::CumulativeReporterBase::SectionNode>>>
              ((vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,Catch::CumulativeReporterBase::SectionNode>>,std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,Catch::CumulativeReporterBase::SectionNode>>>>
                *)&this->m_testCases,&local_18);
    if (this->m_deepestSection != (SectionNode *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->m_deepestSection->stdOut);
      std::__cxx11::string::_M_assign((string *)&this->m_deepestSection->stdErr);
      Detail::
      unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
      ::~unique_ptr(&local_18);
      return;
    }
    __assert_fail("m_deepestSection",
                  "/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.cpp"
                  ,0x2345,
                  "virtual void Catch::CumulativeReporterBase::testCaseEnded(const TestCaseStats &)"
                 );
  }
  __assert_fail("m_ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.hpp"
                ,0x385,
                "T *Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats, Catch::CumulativeReporterBase::SectionNode>>::operator->() [T = Catch::CumulativeReporterBase::Node<Catch::TestCaseStats, Catch::CumulativeReporterBase::SectionNode>]"
               );
}

Assistant:

void CumulativeReporterBase::testCaseEnded(
        TestCaseStats const& testCaseStats ) {
        auto node = Detail::make_unique<TestCaseNode>( testCaseStats );
        assert( m_sectionStack.size() == 0 );
        node->children.push_back( CATCH_MOVE(m_rootSection) );
        m_testCases.push_back( CATCH_MOVE(node) );

        assert( m_deepestSection );
        m_deepestSection->stdOut = testCaseStats.stdOut;
        m_deepestSection->stdErr = testCaseStats.stdErr;
    }